

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_kv.c
# Opt level: O1

int test_kvtree_kv(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *__s1;
  long lVar6;
  bool bVar7;
  kvtree *kvt;
  long local_38;
  
  local_38 = kvtree_new();
  bVar7 = local_38 == 0;
  lVar5 = kvtree_set_kv(local_38,"key","value");
  __s1 = (char *)kvtree_elem_get_first_val(local_38,"key");
  iVar1 = strcmp(__s1,"value");
  iVar2 = kvtree_size(local_38);
  lVar6 = kvtree_get_kv(local_38,"key","value");
  iVar3 = kvtree_unset_kv(local_38,"key","value");
  iVar4 = kvtree_size(local_38);
  kvtree_delete(&local_38);
  return (uint)((iVar1 != 0 || (lVar5 == 0 || bVar7)) ||
               (((iVar4 != 0 || iVar3 != 0) || lVar6 != lVar5) || iVar2 != 1));
}

Assistant:

int test_kvtree_kv(){
  int rc = TEST_PASS;
  char* key = "key";
  char* value = "value";

  kvtree* kvt = kvtree_new();
  if (kvt == NULL) rc = TEST_FAIL;

  kvtree* val = kvtree_set_kv(kvt, key, value);
  if (val == NULL) rc = TEST_FAIL;
  char* valstr = kvtree_elem_get_first_val(kvt, key);
  if(strcmp(valstr, value)) rc = TEST_FAIL;

  int size = kvtree_size(kvt);
  if (size != 1) rc = TEST_FAIL;

  kvtree* get = kvtree_get_kv(kvt, key, value);
  if (get != val) rc = TEST_FAIL;

  if(kvtree_unset_kv(kvt, key, value) != KVTREE_SUCCESS) rc = TEST_FAIL;
  size = kvtree_size(kvt);
  if(size != 0) rc = TEST_FAIL;

  kvtree_delete(&kvt);
  return rc;
}